

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O2

int count_obj_list(OBJ_INDEX_DATA *pObjIndex,OBJ_DATA *list)

{
  int nMatch;
  
  nMatch = 0;
  for (; list != (OBJ_DATA *)0x0; list = list->next_content) {
    nMatch = nMatch + (uint)(list->pIndexData == pObjIndex);
  }
  return nMatch;
}

Assistant:

int count_obj_list(OBJ_INDEX_DATA *pObjIndex, OBJ_DATA *list)
{
	OBJ_DATA *obj;
	int nMatch;

	nMatch = 0;

	for (obj = list; obj != nullptr; obj = obj->next_content)
	{
		if (obj->pIndexData == pObjIndex)
			nMatch++;
	}

	return nMatch;
}